

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall defyx::JitCompilerX86::h_ISUB_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  
  bVar2 = instr->dst;
  this->registerUsage[bVar2] = i;
  if (instr->src == bVar2) {
    puVar1 = this->code + this->codePos;
    puVar1[0] = 'I';
    puVar1[1] = 0x81;
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst + 0xe8;
    iVar3 = this->codePos;
    this->codePos = iVar3 + 1;
    *(uint32_t *)(this->code + (long)iVar3 + 1) = instr->imm32;
    iVar3 = 4;
  }
  else {
    puVar1 = this->code + this->codePos;
    puVar1[0] = 'M';
    puVar1[1] = '+';
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst * '\b' + instr->src + 0xc0;
    iVar3 = 1;
  }
  this->codePos = this->codePos + iVar3;
  return;
}

Assistant:

void JitCompilerX86::h_ISUB_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			emit(REX_SUB_RR);
			emitByte(0xc0 + 8 * instr.dst + instr.src);
		}
		else {
			emit(REX_81);
			emitByte(0xe8 + instr.dst);
			emit32(instr.getImm32());
		}
	}